

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O2

exr_result_t unpack_16bit_3chan(exr_decode_pipeline_t *decode)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  exr_coding_channel_info_t *peVar8;
  void *pvVar9;
  int iVar10;
  uint8_t *puVar11;
  void *pvVar12;
  void *pvVar13;
  uint8_t *puVar14;
  int x;
  ulong uVar15;
  uint8_t *puVar16;
  int iVar17;
  ulong uVar18;
  uint8_t *puVar19;
  long lVar20;
  
  pvVar9 = decode->unpacked_buffer;
  peVar8 = decode->channels;
  uVar1 = peVar8->width;
  iVar10 = (decode->chunk).height;
  iVar2 = peVar8->user_pixel_stride;
  iVar3 = peVar8[1].user_pixel_stride;
  iVar4 = peVar8[2].user_pixel_stride;
  iVar5 = peVar8->user_line_stride;
  iVar6 = peVar8[1].user_line_stride;
  iVar7 = peVar8[2].user_line_stride;
  puVar16 = (peVar8->field_12).decode_to_ptr;
  puVar14 = peVar8[1].field_12.decode_to_ptr;
  puVar19 = peVar8[2].field_12.decode_to_ptr;
  lVar20 = (long)(int)(uVar1 * 6);
  iVar17 = 0;
  uVar18 = 0;
  if (0 < (int)uVar1) {
    uVar18 = (ulong)uVar1;
  }
  if (iVar10 < 1) {
    iVar10 = 0;
  }
  pvVar12 = (void *)((long)pvVar9 + (long)(int)uVar1 * 2);
  pvVar13 = (void *)((long)pvVar9 + (long)(int)uVar1 * 4);
  for (; iVar17 != iVar10; iVar17 = iVar17 + 1) {
    puVar11 = puVar16;
    for (uVar15 = 0; uVar18 != uVar15; uVar15 = uVar15 + 1) {
      *(undefined2 *)puVar11 = *(undefined2 *)((long)pvVar9 + uVar15 * 2);
      puVar11 = puVar11 + iVar2;
    }
    puVar11 = puVar14;
    for (uVar15 = 0; uVar18 != uVar15; uVar15 = uVar15 + 1) {
      *(undefined2 *)puVar11 = *(undefined2 *)((long)pvVar12 + uVar15 * 2);
      puVar11 = puVar11 + iVar3;
    }
    puVar11 = puVar19;
    for (uVar15 = 0; uVar18 != uVar15; uVar15 = uVar15 + 1) {
      *(undefined2 *)puVar11 = *(undefined2 *)((long)pvVar13 + uVar15 * 2);
      puVar11 = puVar11 + iVar4;
    }
    pvVar9 = (void *)((long)pvVar9 + lVar20);
    puVar16 = puVar16 + iVar5;
    puVar14 = puVar14 + iVar6;
    puVar19 = puVar19 + iVar7;
    pvVar12 = (void *)((long)pvVar12 + lVar20);
    pvVar13 = (void *)((long)pvVar13 + lVar20);
  }
  return 0;
}

Assistant:

static exr_result_t
unpack_16bit_3chan (exr_decode_pipeline_t* decode)
{
    /* we know we're unpacking all the channels and there is no subsampling */
    const uint8_t*  srcbuffer = (const uint8_t*) decode->unpacked_buffer;
    const uint16_t *in0, *in1, *in2;
    uint8_t *       out0, *out1, *out2;
    int             w, h;
    int             inc0, inc1, inc2;
    int             linc0, linc1, linc2;

    w     = decode->channels[0].width;
    h     = decode->chunk.height;
    inc0  = decode->channels[0].user_pixel_stride;
    inc1  = decode->channels[1].user_pixel_stride;
    inc2  = decode->channels[2].user_pixel_stride;
    linc0 = decode->channels[0].user_line_stride;
    linc1 = decode->channels[1].user_line_stride;
    linc2 = decode->channels[2].user_line_stride;

    out0 = decode->channels[0].decode_to_ptr;
    out1 = decode->channels[1].decode_to_ptr;
    out2 = decode->channels[2].decode_to_ptr;

    for (int y = 0; y < h; ++y)
    {
        in0 = (const uint16_t*) srcbuffer;
        in1 = in0 + w;
        in2 = in1 + w;
        srcbuffer += w * 6; // 3 * sizeof(uint16_t), avoid type conversion
        for (int x = 0; x < w; ++x)
            *((uint16_t*) (out0 + x * inc0)) = one_to_native16 (in0[x]);
        for (int x = 0; x < w; ++x)
            *((uint16_t*) (out1 + x * inc1)) = one_to_native16 (in1[x]);
        for (int x = 0; x < w; ++x)
            *((uint16_t*) (out2 + x * inc2)) = one_to_native16 (in2[x]);
        out0 += linc0;
        out1 += linc1;
        out2 += linc2;
    }

    return EXR_ERR_SUCCESS;
}